

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::detail::none_t,_toml::error_info> *
toml::detail::parse_table<toml::type_config>
          (location *loc,context<toml::type_config> *ctx,basic_value<toml::type_config> *table)

{
  indent_char iVar1;
  int32_t iVar2;
  bool bVar3;
  vector<toml::error_info,_std::allocator<toml::error_info>_> *pvVar4;
  table_format_info *ptVar5;
  multiline_spacer<toml::type_config> *pmVar6;
  size_type sVar7;
  basic_value<toml::type_config> *in_RDX;
  result<toml::detail::none_t,_toml::error_info> *in_RDI;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> ins_res;
  value_type com_opt;
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  com_res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *com;
  iterator __end0;
  iterator __begin0;
  comment_type *__range5;
  type val;
  type key_reg;
  type keys;
  result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
  kv_res;
  optional<toml::detail::multiline_spacer<toml::type_config>_> sp;
  location start;
  bool newline_found;
  spec *spec;
  size_type num_errors;
  basic_value<toml::type_config> *in_stack_00001318;
  region *in_stack_00001320;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00001328;
  table_type *in_stack_00001330;
  inserting_value_kind in_stack_0000133f;
  undefined7 in_stack_fffffffffffff4c8;
  char_type in_stack_fffffffffffff4cf;
  basic_value<toml::type_config> *in_stack_fffffffffffff4d0;
  result<toml::detail::none_t,_toml::error_info> *this;
  character *in_stack_fffffffffffff4e0;
  size_type sVar8;
  undefined4 in_stack_fffffffffffff4e8;
  int in_stack_fffffffffffff4ec;
  location *in_stack_fffffffffffff4f0;
  source_location in_stack_fffffffffffff4f8;
  basic_value<toml::type_config> *in_stack_fffffffffffff500;
  spec *in_stack_fffffffffffff508;
  source_location in_stack_fffffffffffff510;
  result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
  *in_stack_fffffffffffff528;
  source_location in_stack_fffffffffffff530;
  error_type *in_stack_fffffffffffff538;
  region *in_stack_fffffffffffff540;
  region *in_stack_fffffffffffff548;
  source_location *in_stack_fffffffffffff550;
  location *in_stack_fffffffffffff5c0;
  multiline_spacer<toml::type_config> *in_stack_fffffffffffff5c8;
  byte local_a2b;
  byte local_a2a;
  result<toml::detail::none_t,_toml::error_info> local_a08;
  string *in_stack_fffffffffffff688;
  source_location *in_stack_fffffffffffff690;
  string *in_stack_fffffffffffff698;
  location local_950;
  undefined **local_8f8;
  spec local_8f0 [7];
  undefined1 in_stack_fffffffffffff7cf;
  context<toml::type_config> *in_stack_fffffffffffff7d0;
  location *in_stack_fffffffffffff7d8;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> local_768;
  undefined **local_708;
  undefined8 in_stack_fffffffffffff920;
  undefined8 in_stack_fffffffffffff928;
  result local_678 [112];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_608 [2];
  undefined **local_5f8;
  basic_value<toml::type_config> local_5f0;
  undefined **local_528;
  undefined **local_4b8;
  result local_498 [184];
  context<toml::type_config> *in_stack_fffffffffffffc20;
  location *in_stack_fffffffffffffc28;
  allocator<char> local_341 [264];
  location local_239 [5];
  int local_b8;
  byte local_31;
  spec *local_30;
  size_type local_28;
  source_location local_18;
  
  local_18._M_impl = (__impl *)in_RDX;
  pvVar4 = context<toml::type_config>::errors((context<toml::type_config> *)in_RDX);
  local_28 = std::vector<toml::error_info,_std::allocator<toml::error_info>_>::size(pvVar4);
  local_30 = context<toml::type_config>::toml_spec((context<toml::type_config> *)local_18._M_impl);
  ptVar5 = basic_value<toml::type_config>::as_table_fmt
                     ((basic_value<toml::type_config> *)in_stack_fffffffffffff510._M_impl);
  ptVar5->indent_type = none;
  local_31 = 1;
  do {
    bVar3 = location::eof((location *)in_stack_fffffffffffff4d0);
    if (((bVar3 ^ 0xffU) & 1) == 0) goto LAB_00724671;
    location::location(in_stack_fffffffffffff4f0,
                       (location *)CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8));
    skip_multiline_spacer<toml::type_config>
              (in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,(bool)in_stack_fffffffffffff7cf);
    bVar3 = location::eof((location *)in_stack_fffffffffffff4d0);
    if (bVar3) {
      local_b8 = 3;
    }
    else {
      syntax::ws(in_stack_fffffffffffff508);
      character::character((character *)in_stack_fffffffffffff4d0,in_stack_fffffffffffff4cf);
      sequence::sequence<toml::detail::repeat_at_least,toml::detail::character>
                ((sequence *)in_stack_fffffffffffff4f0,
                 (repeat_at_least *)CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                 in_stack_fffffffffffff4e0);
      sequence::scan((sequence *)in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
      bVar3 = region::is_ok((region *)0x723a74);
      region::~region((region *)in_stack_fffffffffffff4d0);
      sequence::~sequence((sequence *)in_stack_fffffffffffff4d0);
      character::~character((character *)0x723aa2);
      repeat_at_least::~repeat_at_least((repeat_at_least *)in_stack_fffffffffffff4d0);
      if (bVar3) {
        location::operator=((location *)in_stack_fffffffffffff4d0,
                            (location *)
                            CONCAT17(in_stack_fffffffffffff4cf,in_stack_fffffffffffff4c8));
        local_b8 = 3;
      }
      else {
        local_a2a = 1;
        if ((local_31 & 1) == 0) {
          bVar3 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                            ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                             0x723b75);
          local_a2b = 0;
          if (bVar3) {
            in_stack_fffffffffffff5c8 =
                 std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                           ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                            in_stack_fffffffffffff4d0);
            local_a2b = in_stack_fffffffffffff5c8->newline_found;
          }
          local_a2a = local_a2b;
        }
        local_31 = local_a2a & 1;
        if (local_31 == 0) {
          in_stack_fffffffffffff5c0 = local_239;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff510._M_impl,(char *)in_stack_fffffffffffff508,
                     (allocator<char> *)in_stack_fffffffffffff500);
          region::region(in_stack_fffffffffffff540,(location *)in_stack_fffffffffffff538);
          source_location::source_location(in_stack_fffffffffffff550,in_stack_fffffffffffff548);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff510._M_impl,(char *)in_stack_fffffffffffff508,
                     (allocator<char> *)in_stack_fffffffffffff500);
          make_error_info<>(in_stack_fffffffffffff698,in_stack_fffffffffffff690,
                            in_stack_fffffffffffff688);
          err<toml::error_info>((error_info *)in_stack_fffffffffffff528);
          result<toml::detail::none_t,_toml::error_info>::result
                    ((result<toml::detail::none_t,_toml::error_info> *)in_stack_fffffffffffff4d0,
                     (failure_type *)CONCAT17(in_stack_fffffffffffff4cf,in_stack_fffffffffffff4c8));
          failure<toml::error_info>::~failure((failure<toml::error_info> *)0x723cd7);
          error_info::~error_info((error_info *)in_stack_fffffffffffff4d0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d0);
          std::allocator<char>::~allocator(local_341);
          source_location::~source_location((source_location *)in_stack_fffffffffffff4d0);
          region::~region((region *)in_stack_fffffffffffff4d0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d0);
          std::allocator<char>::~allocator((allocator<char> *)local_239);
          local_b8 = 1;
        }
        else {
          bVar3 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                            ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                             0x723e47);
          if ((bVar3) &&
             (pmVar6 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                                 ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                  in_stack_fffffffffffff4d0), pmVar6->indent_type != none)) {
            pmVar6 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                               ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                in_stack_fffffffffffff4d0);
            iVar1 = pmVar6->indent_type;
            ptVar5 = basic_value<toml::type_config>::as_table_fmt
                               ((basic_value<toml::type_config> *)in_stack_fffffffffffff510._M_impl)
            ;
            ptVar5->indent_type = iVar1;
            pmVar6 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                               ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                in_stack_fffffffffffff4d0);
            iVar2 = pmVar6->indent;
            ptVar5 = basic_value<toml::type_config>::as_table_fmt
                               ((basic_value<toml::type_config> *)in_stack_fffffffffffff510._M_impl)
            ;
            ptVar5->body_indent = iVar2;
          }
          local_31 = 0;
          parse_key_value_pair<toml::type_config>
                    (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
          bVar3 = toml::result::operator_cast_to_bool(local_498);
          if (bVar3) {
            local_4b8 = &PTR_s__workspace_llm4binary_github_lic_00a79d60;
            result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
            ::unwrap(in_stack_fffffffffffff528,in_stack_fffffffffffff530);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff4d0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffff4cf,in_stack_fffffffffffff4c8));
            local_528 = &PTR_s__workspace_llm4binary_github_lic_00a79d78;
            result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
            ::unwrap(in_stack_fffffffffffff528,in_stack_fffffffffffff530);
            region::region((region *)in_stack_fffffffffffff4d0,
                           (region *)CONCAT17(in_stack_fffffffffffff4cf,in_stack_fffffffffffff4c8));
            local_5f8 = &PTR_s__workspace_llm4binary_github_lic_00a79d90;
            result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
            ::unwrap(in_stack_fffffffffffff528,in_stack_fffffffffffff530);
            basic_value<toml::type_config>::basic_value
                      (in_stack_fffffffffffff500,
                       (basic_value<toml::type_config> *)in_stack_fffffffffffff4f8._M_impl);
            bVar3 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                              ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                               0x72403a);
            if (bVar3) {
              pmVar6 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                                 ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                  in_stack_fffffffffffff4d0);
              local_608[1]._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &pmVar6->comments;
              local_608[0]._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   preserve_comments::begin_abi_cxx11_
                             ((preserve_comments *)
                              CONCAT17(in_stack_fffffffffffff4cf,in_stack_fffffffffffff4c8));
              local_678._104_8_ =
                   preserve_comments::end_abi_cxx11_
                             ((preserve_comments *)
                              CONCAT17(in_stack_fffffffffffff4cf,in_stack_fffffffffffff4c8));
              while (bVar3 = __gnu_cxx::
                             operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)in_stack_fffffffffffff4d0,
                                        (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)CONCAT17(in_stack_fffffffffffff4cf,
                                                    in_stack_fffffffffffff4c8)),
                    ((bVar3 ^ 0xffU) & 1) != 0) {
                local_678._96_8_ =
                     __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(local_608);
                basic_value<toml::type_config>::comments(&local_5f0);
                preserve_comments::push_back
                          ((preserve_comments *)in_stack_fffffffffffff4d0,
                           (string *)CONCAT17(in_stack_fffffffffffff4cf,in_stack_fffffffffffff4c8));
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(local_608);
              }
            }
            parse_comment_line<toml::type_config>
                      ((location *)in_stack_fffffffffffff928,
                       (context<toml::type_config> *)in_stack_fffffffffffff920);
            bVar3 = toml::result::operator_cast_to_bool(local_678);
            if (bVar3) {
              in_stack_fffffffffffff550 =
                   (source_location *)
                   result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                   ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                             *)in_stack_fffffffffffff528,in_stack_fffffffffffff530);
              std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffff4d0,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_fffffffffffff4cf,in_stack_fffffffffffff4c8));
              bVar3 = std::optional::operator_cast_to_bool
                                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)0x7241ea);
              if (bVar3) {
                in_stack_fffffffffffff540 =
                     (region *)basic_value<toml::type_config>::comments(&local_5f0);
                in_stack_fffffffffffff548 =
                     (region *)
                     std::
                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffff4d0);
                preserve_comments::push_back
                          ((preserve_comments *)in_stack_fffffffffffff4d0,
                           (string *)CONCAT17(in_stack_fffffffffffff4cf,in_stack_fffffffffffff4c8));
                local_31 = 1;
              }
              std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x724286);
            }
            else {
              local_708 = &PTR_s__workspace_llm4binary_github_lic_00a79dc0;
              in_stack_fffffffffffff530._M_impl = local_18._M_impl;
              in_stack_fffffffffffff538 =
                   result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                   ::unwrap_err((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                 *)in_stack_fffffffffffff528,local_18);
              in_stack_fffffffffffff528 =
                   (result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                    *)&stack0xfffffffffffff900;
              error_info::error_info
                        ((error_info *)in_stack_fffffffffffff4d0,
                         (error_info *)CONCAT17(in_stack_fffffffffffff4cf,in_stack_fffffffffffff4c8)
                        );
              context<toml::type_config>::report_error
                        ((context<toml::type_config> *)in_stack_fffffffffffff4d0,
                         (error_info *)CONCAT17(in_stack_fffffffffffff4cf,in_stack_fffffffffffff4c8)
                        );
              error_info::~error_info((error_info *)in_stack_fffffffffffff4d0);
            }
            result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
            ::~result((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                       *)0x72432d);
            basic_value<toml::type_config>::as_table_abi_cxx11_
                      ((basic_value<toml::type_config> *)in_stack_fffffffffffff510._M_impl);
            region::region((region *)in_stack_fffffffffffff4d0,
                           (region *)CONCAT17(in_stack_fffffffffffff4cf,in_stack_fffffffffffff4c8));
            basic_value<toml::type_config>::basic_value
                      (in_stack_fffffffffffff500,
                       (basic_value<toml::type_config> *)in_stack_fffffffffffff4f8._M_impl);
            insert_value<toml::type_config>
                      (in_stack_0000133f,in_stack_00001330,in_stack_00001328,in_stack_00001320,
                       in_stack_00001318);
            basic_value<toml::type_config>::~basic_value(in_stack_fffffffffffff4d0);
            region::~region((region *)in_stack_fffffffffffff4d0);
            bVar3 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::is_err
                              (&local_768);
            if (bVar3) {
              local_8f8 = &PTR_s__workspace_llm4binary_github_lic_00a79dd8;
              in_stack_fffffffffffff510._M_impl = local_18._M_impl;
              result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap_err
                        ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                         in_stack_fffffffffffff528,in_stack_fffffffffffff530);
              in_stack_fffffffffffff508 = local_8f0;
              error_info::error_info
                        ((error_info *)in_stack_fffffffffffff4d0,
                         (error_info *)CONCAT17(in_stack_fffffffffffff4cf,in_stack_fffffffffffff4c8)
                        );
              context<toml::type_config>::report_error
                        ((context<toml::type_config> *)in_stack_fffffffffffff4d0,
                         (error_info *)CONCAT17(in_stack_fffffffffffff4cf,in_stack_fffffffffffff4c8)
                        );
              error_info::~error_info((error_info *)in_stack_fffffffffffff4d0);
            }
            result<toml::basic_value<toml::type_config>_*,_toml::error_info>::~result
                      ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)0x7244de)
            ;
            basic_value<toml::type_config>::~basic_value(in_stack_fffffffffffff4d0);
            region::~region((region *)in_stack_fffffffffffff4d0);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff4e0);
          }
          else {
            in_stack_fffffffffffff4f8._M_impl = local_18._M_impl;
            in_stack_fffffffffffff500 =
                 (basic_value<toml::type_config> *)
                 result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                 ::unwrap_err(in_stack_fffffffffffff528,in_stack_fffffffffffff530);
            in_stack_fffffffffffff4f0 = &local_950;
            error_info::error_info
                      ((error_info *)in_stack_fffffffffffff4d0,
                       (error_info *)CONCAT17(in_stack_fffffffffffff4cf,in_stack_fffffffffffff4c8));
            context<toml::type_config>::report_error
                      ((context<toml::type_config> *)in_stack_fffffffffffff4d0,
                       (error_info *)CONCAT17(in_stack_fffffffffffff4cf,in_stack_fffffffffffff4c8));
            error_info::~error_info((error_info *)in_stack_fffffffffffff4d0);
            skip_key_value_pair<toml::type_config>
                      ((location *)in_stack_fffffffffffff4d0,
                       (context<toml::type_config> *)
                       CONCAT17(in_stack_fffffffffffff4cf,in_stack_fffffffffffff4c8));
          }
          result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
          ::~result((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                     *)0x7245f9);
          local_b8 = 0;
        }
      }
    }
    std::optional<toml::detail::multiline_spacer<toml::type_config>_>::~optional
              ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)0x724611);
    location::~location((location *)in_stack_fffffffffffff4d0);
    in_stack_fffffffffffff4ec = local_b8;
  } while (local_b8 == 0);
  if (local_b8 != 1) {
LAB_00724671:
    sVar8 = local_28;
    pvVar4 = context<toml::type_config>::errors((context<toml::type_config> *)local_18._M_impl);
    sVar7 = std::vector<toml::error_info,_std::allocator<toml::error_info>_>::size(pvVar4);
    if (sVar8 < sVar7) {
      this = &local_a08;
      context<toml::type_config>::pop_last_error
                ((context<toml::type_config> *)
                 CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8));
      err<toml::error_info>((error_info *)in_stack_fffffffffffff528);
      result<toml::detail::none_t,_toml::error_info>::result
                (this,(failure_type *)CONCAT17(in_stack_fffffffffffff4cf,in_stack_fffffffffffff4c8))
      ;
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x7246f6);
      error_info::~error_info((error_info *)this);
    }
    else {
      ok();
      result<toml::detail::none_t,_toml::error_info>::result(in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

result<none_t, error_info>
parse_table(location& loc, context<TC>& ctx, basic_value<TC>& table)
{
    assert(table.is_table());

    const auto num_errors = ctx.errors().size();
    const auto& spec = ctx.toml_spec();

    // clear indent info
    table.as_table_fmt().indent_type = indent_char::none;

    bool newline_found = true;
    while( ! loc.eof())
    {
        const auto start = loc;

        auto sp = skip_multiline_spacer(loc, ctx, newline_found);

        // if reached to EOF, the table ends here. return.
        if(loc.eof())
        {
            break;
        }
        // if next table is comming, return.
        if(sequence(syntax::ws(spec), character('[')).scan(loc).is_ok())
        {
            loc = start;
            break;
        }
        // otherwise, it should be a key-value pair.
        newline_found = newline_found || (sp.has_value() && sp.value().newline_found);
        if( ! newline_found)
        {
            return err(make_error_info("toml::parse_table: "
                "newline (LF / CRLF) or EOF is expected",
                source_location(region(loc)), "here"));
        }
        if(sp.has_value() && sp.value().indent_type != indent_char::none)
        {
            table.as_table_fmt().indent_type = sp.value().indent_type;
            table.as_table_fmt().body_indent = sp.value().indent;
        }

        newline_found = false; // reset
        if(auto kv_res = parse_key_value_pair(loc, ctx))
        {
            auto keys    = std::move(kv_res.unwrap().first.first);
            auto key_reg = std::move(kv_res.unwrap().first.second);
            auto val     = std::move(kv_res.unwrap().second);

            if(sp.has_value())
            {
                for(const auto& com : sp.value().comments)
                {
                    val.comments().push_back(com);
                }
            }

            if(auto com_res = parse_comment_line(loc, ctx))
            {
                if(auto com_opt = com_res.unwrap())
                {
                    val.comments().push_back(com_opt.value());
                    newline_found = true; // comment includes newline at the end
                }
            }
            else
            {
                ctx.report_error(std::move(com_res.unwrap_err()));
            }

            auto ins_res = insert_value(inserting_value_kind::dotted_keys,
                    std::addressof(table.as_table()),
                    keys, std::move(key_reg), std::move(val));
            if(ins_res.is_err())
            {
                ctx.report_error(std::move(ins_res.unwrap_err()));
            }
        }
        else
        {
            ctx.report_error(std::move(kv_res.unwrap_err()));
            skip_key_value_pair(loc, ctx);
        }
    }

    if(num_errors < ctx.errors().size())
    {
        assert(ctx.has_error()); // already reported
        return err(ctx.pop_last_error());
    }
    return ok();
}